

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::TrackAddPropertyTypes(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  JITType *pJVar8;
  JITTypeHandler *oldTypeHandler;
  JITTypeHandler *newTypeHandler;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *pHVar9;
  PropertySym *pPVar10;
  AddPropertyCacheBucket *this_00;
  bool local_189;
  JITTypeHolderBase<void> *local_188;
  bool local_175;
  bool local_163;
  byte local_162;
  byte local_161;
  JITTypeHolder local_158;
  JITTypeHolder local_150;
  Type local_148;
  nullptr_t local_140;
  Type local_138;
  Type local_130;
  Type local_128;
  JITTypeHandler *local_120;
  JITTypeHandler *checkFinalTypeHandler;
  JITTypeHandler *local_110;
  JITTypeHandler *oldFinalTypeHandler;
  nullptr_t local_100;
  JITTypeHolderBase<void> local_f8;
  JITTypeHolder checkFinalType;
  JITTypeHolderBase<void> local_d0;
  JITTypeHolderBase<void> local_c8;
  JITTypeHolderBase<void> local_c0;
  nullptr_t local_b8;
  JITTypeHolderBase<void> local_b0;
  JITTypeHolderBase<void> local_a8;
  JITTypeHolder deadStoreUnavailableFinalType;
  JITTypeHolder finalType;
  AddPropertyCacheBucket *pBucket;
  PropertySym *propertySym;
  JITTypeHandler *typeWithPropertyTypeHandler;
  JITTypeHandler *typeWithoutPropertyTypeHandler;
  Type local_70;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  nullptr_t local_58;
  JITTypeHolderBase<void> local_50;
  AddPropertyCacheBucket *local_48;
  AddPropertyCacheBucket *pBucket_1;
  PropertySym *propertySym_1;
  JITTypeHolderBase<void> local_30;
  JITTypeHolder typeWithoutProperty;
  JITTypeHolder typeWithProperty;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  BackwardPass *this_local;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1691,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = IR::PropertySymOpnd::IsMono(opnd);
  if ((!bVar2) && (bVar2 = IR::PropertySymOpnd::HasEquivalentTypeSet(opnd), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1692,"(opnd->IsMono() || opnd->HasEquivalentTypeSet())",
                       "opnd->IsMono() || opnd->HasEquivalentTypeSet()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = IR::PropertySymOpnd::IsMono(opnd);
  if (bVar2) {
    typeWithoutProperty = IR::PropertySymOpnd::GetType(opnd);
  }
  else {
    typeWithoutProperty = IR::PropertySymOpnd::GetFirstEquivalentType(opnd);
  }
  bVar2 = IR::PropertySymOpnd::HasInitialType(opnd);
  if (bVar2) {
    local_30.t = (Type)IR::PropertySymOpnd::GetInitialType(opnd);
  }
  else {
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_30,(JITType *)0x0);
  }
  propertySym_1 = (PropertySym *)0x0;
  bVar2 = JITTypeHolderBase<void>::operator==(&local_30,&propertySym_1);
  local_161 = 1;
  if (!bVar2) {
    bVar2 = JITTypeHolderBase<void>::operator==(&typeWithoutProperty,&local_30);
    local_161 = 1;
    if (!bVar2) {
      bVar2 = IR::PropertySymOpnd::IsTypeChecked(opnd);
      local_162 = 0;
      if (bVar2) {
        bVar2 = IR::PropertySymOpnd::IsInitialTypeChecked(opnd);
        local_162 = bVar2 ^ 0xff;
      }
      local_161 = local_162;
    }
  }
  if ((local_161 & 1) == 0) {
    typeWithoutPropertyTypeHandler = (JITTypeHandler *)0x0;
    bVar2 = JITTypeHolderBase<void>::operator!=
                      (&typeWithoutProperty,&typeWithoutPropertyTypeHandler);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x16aa,"(typeWithProperty != nullptr)","typeWithProperty != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJVar8 = JITTypeHolderBase<void>::operator->(&local_30);
    oldTypeHandler = JITType::GetTypeHandler(pJVar8);
    pJVar8 = JITTypeHolderBase<void>::operator->(&typeWithoutProperty);
    newTypeHandler = JITType::GetTypeHandler(pJVar8);
    bVar2 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining
                      (oldTypeHandler,newTypeHandler);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x16b0,
                         "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler))"
                         ,"TypeHandlers are not compatible for transition?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    iVar3 = JITTypeHandler::GetSlotCapacity(oldTypeHandler);
    iVar4 = JITTypeHandler::GetSlotCapacity(newTypeHandler);
    if (iVar4 < iVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x16b1,
                         "(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity())"
                         ,
                         "typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (block->stackSymToFinalType ==
        (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
      pHVar9 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::New
                         (&this->tempAlloc->super_ArenaAllocator,8);
      block->stackSymToFinalType = pHVar9;
    }
    pPVar10 = Sym::AsPropertySym((opnd->super_SymOpnd).m_sym);
    this_00 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                        (block->stackSymToFinalType,(pPVar10->m_stackSym->super_Sym).m_id);
    JITTypeHolderBase<void>::JITTypeHolderBase(&deadStoreUnavailableFinalType,(JITType *)0x0);
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_a8,(JITType *)0x0);
    local_b0.t = (Type)AddPropertyCacheBucket::GetInitialType(this_00);
    local_b8 = (nullptr_t)0x0;
    bVar2 = JITTypeHolderBase<void>::operator==(&local_b0,&local_b8);
    local_175 = true;
    if (!bVar2) {
      local_c0.t = (Type)IR::PropertySymOpnd::GetType(opnd);
      local_c8.t = (Type)AddPropertyCacheBucket::GetInitialType(this_00);
      local_175 = JITTypeHolderBase<void>::operator!=(&local_c0,&local_c8);
    }
    if (local_175 == false) {
      deadStoreUnavailableFinalType = AddPropertyCacheBucket::GetFinalType(this_00);
      local_a8.t = (this_00->deadStoreUnavailableFinalType).t;
    }
    else {
      local_d0.t = (Type)IR::PropertySymOpnd::GetType(opnd);
      bVar2 = JITTypeHolderBase<void>::operator==
                        (&local_d0,&this_00->deadStoreUnavailableInitialType);
      if (bVar2) {
        local_a8.t = (this_00->deadStoreUnavailableFinalType).t;
      }
      deadStoreUnavailableFinalType = IR::PropertySymOpnd::GetType(opnd);
      AddPropertyCacheBucket::SetFinalType(this_00,deadStoreUnavailableFinalType);
    }
    checkFinalType.t = local_30.t;
    AddPropertyCacheBucket::SetInitialType(this_00,(JITTypeHolder)local_30.t);
    SetTypeIDWithFinalType(this,(pPVar10->m_stackSym->super_Sym).m_id,block);
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ObjTypeSpecStorePhase,uVar5,uVar6);
    if (!bVar2) {
      bVar2 = IR::PropertySymOpnd::IsTypeDead(opnd);
      if (!bVar2) {
        local_100 = (nullptr_t)0x0;
        bVar2 = JITTypeHolderBase<void>::operator!=(&local_a8,&local_100);
        if (bVar2) {
          local_188 = &local_a8;
        }
        else {
          local_188 = &deadStoreUnavailableFinalType;
        }
        local_f8.t = local_188->t;
        bVar2 = IR::PropertySymOpnd::HasFinalType(opnd);
        local_189 = false;
        if (bVar2) {
          oldFinalTypeHandler = (JITTypeHandler *)IR::PropertySymOpnd::GetFinalType(opnd);
          local_189 = JITTypeHolderBase<void>::operator!=
                                ((JITTypeHolderBase<void> *)&oldFinalTypeHandler,&local_f8);
        }
        if (local_189 != false) {
          checkFinalTypeHandler = (JITTypeHandler *)IR::PropertySymOpnd::GetFinalType(opnd);
          pJVar8 = JITTypeHolderBase<void>::operator->
                             ((JITTypeHolderBase<void> *)&checkFinalTypeHandler);
          local_110 = JITType::GetTypeHandler(pJVar8);
          pJVar8 = JITTypeHolderBase<void>::operator->(&local_f8);
          local_120 = JITType::GetTypeHandler(pJVar8);
          bVar2 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining
                            (local_110,local_120);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x16ff,
                               "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler))"
                               ,"TypeHandlers should be compatible for transition.");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          iVar3 = JITTypeHandler::GetSlotCapacity(local_110);
          iVar4 = JITTypeHandler::GetSlotCapacity(local_120);
          if (iVar4 < iVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1700,
                               "(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity())"
                               ,
                               "oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
      }
      bVar2 = IR::PropertySymOpnd::IsBeingAdded(opnd);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1704,"(opnd->IsBeingAdded())","opnd->IsBeingAdded()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = IsPrePass(this);
      if (!bVar2) {
        local_128 = deadStoreUnavailableFinalType.t;
        IR::PropertySymOpnd::SetFinalType(opnd,deadStoreUnavailableFinalType);
      }
      bVar2 = IR::PropertySymOpnd::IsTypeChecked(opnd);
      if ((!bVar2) && (bVar2 = IR::PropertySymOpnd::IsTypeAvailable(opnd), bVar2)) {
        local_130 = (Type)AddPropertyCacheBucket::GetInitialType(this_00);
        AddPropertyCacheBucket::SetFinalType(this_00,(JITTypeHolder)local_130);
      }
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecStorePhase,uVar5,uVar6);
    if (bVar2) {
      Output::Print(L"ObjTypeSpecStore: ");
      IR::Instr::Dump(this->currentInstr);
      AddPropertyCacheBucket::Dump(this_00);
    }
    bVar2 = IR::PropertySymOpnd::IsTypeAvailable(opnd);
    if (!bVar2) {
      local_138 = (Type)AddPropertyCacheBucket::GetInitialType(this_00);
      (this_00->deadStoreUnavailableInitialType).t = local_138;
      local_140 = (nullptr_t)0x0;
      bVar2 = JITTypeHolderBase<void>::operator==
                        (&this_00->deadStoreUnavailableFinalType,&local_140);
      if (bVar2) {
        local_148 = (Type)AddPropertyCacheBucket::GetFinalType(this_00);
        (this_00->deadStoreUnavailableFinalType).t = local_148;
      }
      JITTypeHolderBase<void>::JITTypeHolderBase(&local_150,(JITType *)0x0);
      AddPropertyCacheBucket::SetInitialType(this_00,local_150);
      JITTypeHolderBase<void>::JITTypeHolderBase(&local_158,(JITType *)0x0);
      AddPropertyCacheBucket::SetFinalType(this_00,local_158);
      ClearTypeIDWithFinalType(this,(pPVar10->m_stackSym->super_Sym).m_id,block);
    }
  }
  else {
    bVar2 = IsPrePass(this);
    if (((!bVar2) &&
        (block->stackSymToFinalType !=
         (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0)) &&
       (bVar2 = IR::Instr::HasBailOutInfo(this->currentInstr), !bVar2)) {
      pBucket_1 = (AddPropertyCacheBucket *)Sym::AsPropertySym((opnd->super_SymOpnd).m_sym);
      local_48 = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                           (block->stackSymToFinalType,
                            (((PropertySym *)pBucket_1)->m_stackSym->super_Sym).m_id);
      local_163 = false;
      if (local_48 != (AddPropertyCacheBucket *)0x0) {
        local_50.t = (Type)AddPropertyCacheBucket::GetFinalType(local_48);
        local_58 = (nullptr_t)0x0;
        bVar2 = JITTypeHolderBase<void>::operator!=(&local_50,&local_58);
        local_163 = false;
        if (bVar2) {
          local_60.t = (Type)AddPropertyCacheBucket::GetInitialType(local_48);
          local_68.t = (Type)AddPropertyCacheBucket::GetFinalType(local_48);
          local_163 = JITTypeHolderBase<void>::operator!=(&local_60,&local_68);
        }
      }
      if (local_163 != false) {
        local_70 = (Type)AddPropertyCacheBucket::GetFinalType(local_48);
        IR::PropertySymOpnd::SetFinalType(opnd,(JITTypeHolder)local_70);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackAddPropertyTypes(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    // Do the work of objtypespec add-property opt even if it's disabled by PHASE option, so that we have
    // the dataflow info that can be inspected.

    Assert(this->tag == Js::DeadStorePhase);
    Assert(opnd->IsMono() || opnd->HasEquivalentTypeSet());

    JITTypeHolder typeWithProperty = opnd->IsMono() ? opnd->GetType() : opnd->GetFirstEquivalentType();
    JITTypeHolder typeWithoutProperty = opnd->HasInitialType() ? opnd->GetInitialType() : JITTypeHolder(nullptr);

    if (typeWithoutProperty == nullptr ||
        typeWithProperty == typeWithoutProperty ||
        (opnd->IsTypeChecked() && !opnd->IsInitialTypeChecked()))
    {
        if (!this->IsPrePass() && block->stackSymToFinalType != nullptr && !this->currentInstr->HasBailOutInfo())
        {
            PropertySym *propertySym = opnd->m_sym->AsPropertySym();
            AddPropertyCacheBucket *pBucket =
                block->stackSymToFinalType->Get(propertySym->m_stackSym->m_id);
            if (pBucket && pBucket->GetFinalType() != nullptr && pBucket->GetInitialType() != pBucket->GetFinalType())
            {
                opnd->SetFinalType(pBucket->GetFinalType());
            }
        }

        return;
    }

#if DBG
    Assert(typeWithProperty != nullptr);
    const JITTypeHandler * typeWithoutPropertyTypeHandler = typeWithoutProperty->GetTypeHandler();
    const JITTypeHandler * typeWithPropertyTypeHandler = typeWithProperty->GetTypeHandler();
    // TODO: OOP JIT, reenable assert
    //Assert(typeWithoutPropertyTypeHandler->GetPropertyCount() + 1 == typeWithPropertyTypeHandler->GetPropertyCount());
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(typeWithoutPropertyTypeHandler, typeWithPropertyTypeHandler),
        "TypeHandlers are not compatible for transition?");
    Assert(typeWithoutPropertyTypeHandler->GetSlotCapacity() <= typeWithPropertyTypeHandler->GetSlotCapacity());
#endif

    // If there's already a final type for this instance, record it on the operand.
    // If not, start tracking it.
    if (block->stackSymToFinalType == nullptr)
    {
        block->stackSymToFinalType = HashTable<AddPropertyCacheBucket>::New(this->tempAlloc, 8);
    }

    // Find or create the type-tracking record for this instance in this block.
    PropertySym *propertySym = opnd->m_sym->AsPropertySym();
    AddPropertyCacheBucket *pBucket =
        block->stackSymToFinalType->FindOrInsertNew(propertySym->m_stackSym->m_id);

    JITTypeHolder finalType(nullptr);
#if DBG
    JITTypeHolder deadStoreUnavailableFinalType(nullptr);
#endif
    if (pBucket->GetInitialType() == nullptr || opnd->GetType() != pBucket->GetInitialType())
    {
#if DBG
        if (opnd->GetType() == pBucket->deadStoreUnavailableInitialType)
        {
            deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
        }
#endif
        // No info found, or the info was bad, so initialize it from this cache.
        finalType = opnd->GetType();
        pBucket->SetFinalType(finalType);
    }
    else
    {
        // Match: The type we push upward is now the typeWithoutProperty at this point,
        // and the final type is the one we've been tracking.
        finalType = pBucket->GetFinalType();
#if DBG
        deadStoreUnavailableFinalType = pBucket->deadStoreUnavailableFinalType;
#endif
    }

    pBucket->SetInitialType(typeWithoutProperty);
    this->SetTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);

    if (!PHASE_OFF(Js::ObjTypeSpecStorePhase, this->func))
    {
#if DBG

        // We may regress in this case:
        // if (b)
        //      t1 = {};
        //      o = t1;
        //      o.x =
        // else
        //      t2 = {};
        //      o = t2;
        //      o.x =
        // o.y =
        //
        // Where the backward pass will propagate the final type in o.y to o.x, then globopt will copy prop t1 and t2 to o.x.
        // But not o.y (because of the merge).  Then, in the dead store pass, o.y's final type will not propagate to t1.x and t2.x
        // respectively, thus regression the final type.  However, in both cases, the types of t1 and t2 are dead anyways.
        //
        // if the type is dead, we don't care if we have regressed the type, as no one is depending on it to skip type check anyways
        if (!opnd->IsTypeDead())
        {
            // This is the type that would have been propagated if we didn't kill it because the type isn't available
            JITTypeHolder checkFinalType = deadStoreUnavailableFinalType != nullptr ? deadStoreUnavailableFinalType : finalType;
            if (opnd->HasFinalType() && opnd->GetFinalType() != checkFinalType)
            {
                // Final type discovery must be progressively better (unless we kill it in the deadstore pass
                // when the type is not available during the forward pass)
                const JITTypeHandler * oldFinalTypeHandler = opnd->GetFinalType()->GetTypeHandler();
                const JITTypeHandler * checkFinalTypeHandler = checkFinalType->GetTypeHandler();

                // TODO: OOP JIT, enable assert
                //Assert(oldFinalTypeHandler->GetPropertyCount() < checkFinalTypeHandler->GetPropertyCount());
                AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(oldFinalTypeHandler, checkFinalTypeHandler),
                    "TypeHandlers should be compatible for transition.");
                Assert(oldFinalTypeHandler->GetSlotCapacity() <= checkFinalTypeHandler->GetSlotCapacity());
            }
        }
#endif
        Assert(opnd->IsBeingAdded());
        if (!this->IsPrePass())
        {
            opnd->SetFinalType(finalType);
        }
        if (!opnd->IsTypeChecked())
        {
            // Transition from initial to final type will only happen at type check points.
            if (opnd->IsTypeAvailable())
            {
                pBucket->SetFinalType(pBucket->GetInitialType());
            }
        }
    }

#if DBG_DUMP
    if (PHASE_TRACE(Js::ObjTypeSpecStorePhase, this->func))
    {
        Output::Print(_u("ObjTypeSpecStore: "));
        this->currentInstr->Dump();
        pBucket->Dump();
    }
#endif

    // In the dead-store pass, we have forward information that tells us whether a "final type"
    // reached this point from an earlier store. If it didn't (i.e., it's not available here),
    // remove it from the backward map so that upstream stores will use the final type that is
    // live there. (This avoids unnecessary bailouts in cases where the final type is only live
    // on one branch of an "if", a case that the initial backward pass can't detect.)
    // An example:
    //  if (cond)
    //      o.x =
    //  o.y =

    if (!opnd->IsTypeAvailable())
    {
#if DBG
        pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
        if (pBucket->deadStoreUnavailableFinalType == nullptr)
        {
            pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
        }
        pBucket->SetInitialType(nullptr);
        pBucket->SetFinalType(nullptr);
#else
        block->stackSymToFinalType->Clear(propertySym->m_stackSym->m_id);
#endif
        this->ClearTypeIDWithFinalType(propertySym->m_stackSym->m_id, block);
    }
}